

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowCustomAggregator::Finalize
          (WindowCustomAggregator *this,WindowAggregatorState *gstate,WindowAggregatorState *lstate,
          CollectionPtr collection,FrameStats *stats)

{
  idx_t *__mutex;
  reallocate_function_ptr_t *mask;
  idx_t *this_00;
  Allocator *pAVar1;
  size_type *psVar2;
  size_type __n;
  aggregate_wininit_t p_Var3;
  optional_ptr<duckdb::FunctionData,_true> __p;
  WindowCollection *pWVar4;
  reference pvVar5;
  type pWVar6;
  type pWVar7;
  size_type *psVar8;
  WindowAggregatorLocalState *lastate;
  WindowAggregatorGlobalState *gasink;
  CollectionPtr collection_local;
  AggregateInputData aggr_input_data;
  idx_t count;
  pointer inputs;
  vector<bool,_true> all_valids;
  
  __mutex = &gstate[5].allocator.allocated_size;
  collection_local = collection;
  ::std::mutex::lock((mutex *)__mutex);
  if (gstate[6].allocator.arena_allocator.allocate_function == (allocate_function_ptr_t)0x0) {
    (*lstate->_vptr_WindowAggregatorState[2])(lstate,gstate,collection_local.ptr);
    pWVar4 = optional_ptr<duckdb::WindowCollection,_true>::operator->(&collection_local);
    inputs = (pWVar4->inputs).
             super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
             .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
    pWVar4 = optional_ptr<duckdb::WindowCollection,_true>::operator->(&collection_local);
    count = pWVar4->count;
    all_valids.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    all_valids.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    all_valids.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    all_valids.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    all_valids.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    psVar2 = (this->super_WindowAggregator).child_idx.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar8 = (this->super_WindowAggregator).child_idx.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; psVar8 != psVar2; psVar8 = psVar8 + 1) {
      __n = *psVar8;
      pWVar4 = optional_ptr<duckdb::WindowCollection,_true>::operator->(&collection_local);
      pvVar5 = vector<std::atomic<bool>,_true>::get<true>(&pWVar4->all_valids,__n);
      ::std::vector<bool,_std::allocator<bool>_>::push_back
                (&all_valids.super_vector<bool,_std::allocator<bool>_>,
                 (bool)((pvVar5->_M_base)._M_i & 1));
    }
    mask = &gstate[6].allocator.arena_allocator.reallocate_function;
    ValidityArray::Pack((ValidityArray *)&gstate[5].allocator.arena_allocator.free_function,
                        (ValidityMask *)mask,
                        (idx_t)gstate[5].allocator.arena_allocator.private_data.
                               super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                               .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                               _M_head_impl);
    make_uniq<duckdb::WindowPartitionInput,duckdb::ClientContext&,duckdb::ColumnDataCollection*&,unsigned_long_const&,duckdb::vector<unsigned_long,true>&,duckdb::vector<bool,true>&,duckdb::ValidityMask&,std::array<duckdb::FrameDelta,2ul>const&>
              ((duckdb *)&aggr_input_data,
               (ClientContext *)gstate[6].allocator.arena_allocator.free_function,&inputs,&count,
               &(this->super_WindowAggregator).child_idx,&all_valids,(ValidityMask *)mask,stats);
    __p = aggr_input_data.bind_data;
    this_00 = &gstate[7].allocator.initial_capacity;
    aggr_input_data.bind_data.ptr = (FunctionData *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>_>
    ::reset((__uniq_ptr_impl<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>_>
             *)this_00,(pointer)__p.ptr);
    ::std::
    unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>_>::
    ~unique_ptr((unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>_>
                 *)&aggr_input_data);
    if ((this->super_WindowAggregator).aggr.function.window_init != (aggregate_wininit_t)0x0) {
      pWVar6 = unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
               ::operator*((unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
                            *)&gstate[7].allocator);
      aggr_input_data.bind_data.ptr =
           AggregateObject::GetFunctionData(&(this->super_WindowAggregator).aggr);
      aggr_input_data.allocator =
           &(pWVar6->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
      aggr_input_data.combine_type = PRESERVE_INPUT;
      p_Var3 = (this->super_WindowAggregator).aggr.function.window_init;
      pWVar7 = unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
               ::operator*((unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
                            *)this_00);
      (*p_Var3)(&aggr_input_data,pWVar7,
                (pWVar6->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
    }
    LOCK();
    pAVar1 = &gstate[6].allocator.arena_allocator;
    pAVar1->allocate_function = pAVar1->allocate_function + 1;
    UNLOCK();
    ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&all_valids);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void WindowCustomAggregator::Finalize(WindowAggregatorState &gstate, WindowAggregatorState &lstate,
                                      CollectionPtr collection, const FrameStats &stats) {
	//	Single threaded Finalize for now
	auto &gcsink = gstate.Cast<WindowCustomAggregatorGlobalState>();
	lock_guard<mutex> gestate_guard(gcsink.lock);
	if (gcsink.finalized) {
		return;
	}

	WindowAggregator::Finalize(gstate, lstate, collection, stats);

	auto inputs = collection->inputs.get();
	const auto count = collection->size();
	vector<bool> all_valids;
	for (auto col_idx : child_idx) {
		all_valids.push_back(collection->all_valids[col_idx]);
	}
	auto &filter_mask = gcsink.filter_mask;
	auto &filter_packed = gcsink.filter_packed;
	filter_mask.Pack(filter_packed, filter_mask.Capacity());

	gcsink.partition_input =
	    make_uniq<WindowPartitionInput>(gcsink.context, inputs, count, child_idx, all_valids, filter_packed, stats);

	if (aggr.function.window_init) {
		auto &gcstate = *gcsink.gcstate;

		AggregateInputData aggr_input_data(aggr.GetFunctionData(), gcstate.allocator);
		aggr.function.window_init(aggr_input_data, *gcsink.partition_input, gcstate.state.data());
	}

	++gcsink.finalized;
}